

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

ZSTD_symbolEncodingTypeStats_t *
ZSTD_buildSequencesStatistics
          (ZSTD_symbolEncodingTypeStats_t *__return_storage_ptr__,seqStore_t *seqStorePtr,
          size_t nbSeq,ZSTD_fseCTables_t *prevEntropy,ZSTD_fseCTables_t *nextEntropy,BYTE *dst,
          BYTE *dstEnd,ZSTD_strategy strategy,uint *countWorkspace,void *entropyWorkspace,
          size_t entropyWkspSize)

{
  FSE_CTable *pFVar1;
  ZSTD_fseCTables_t *nextCTable;
  ZSTD_fseCTables_t *prevCTable;
  symbolEncodingType_e sVar2;
  size_t sVar3;
  ZSTD_symbolEncodingTypeStats_t *pZVar4;
  BYTE *pBVar5;
  ZSTD_symbolEncodingTypeStats_t *pZVar6;
  FSE_CTable *prevCTable_00;
  uint max;
  ZSTD_symbolEncodingTypeStats_t *local_78;
  FSE_CTable *local_70;
  FSE_CTable *local_68;
  BYTE *local_60;
  uint max_1;
  BYTE *local_50;
  ZSTD_fseCTables_t *local_48;
  ZSTD_fseCTables_t *local_40;
  uint max_2;
  
  local_68 = (FSE_CTable *)seqStorePtr->ofCode;
  pBVar5 = seqStorePtr->llCode;
  local_50 = seqStorePtr->mlCode;
  __return_storage_ptr__->lastCountSize = 0;
  local_70 = nextEntropy->litlengthCTable;
  local_60 = dst;
  ZSTD_seqToCodes(seqStorePtr);
  max = 0x23;
  sVar3 = HIST_countFast_wksp(countWorkspace,&max,pBVar5,nbSeq,entropyWorkspace,entropyWkspSize);
  nextEntropy->litlength_repeatMode = prevEntropy->litlength_repeatMode;
  local_48 = nextEntropy;
  local_40 = prevEntropy;
  sVar2 = ZSTD_selectEncodingType
                    (&nextEntropy->litlength_repeatMode,countWorkspace,max,sVar3,nbSeq,9,
                     prevEntropy->litlengthCTable,LL_defaultNorm,6,ZSTD_defaultAllowed,strategy);
  pFVar1 = local_70;
  __return_storage_ptr__->LLtype = sVar2;
  local_70 = (FSE_CTable *)nbSeq;
  pZVar4 = (ZSTD_symbolEncodingTypeStats_t *)
           ZSTD_buildCTable(local_60,(long)dstEnd - (long)local_60,pFVar1,9,sVar2,countWorkspace,max
                            ,pBVar5,nbSeq,LL_defaultNorm,6,0x23,prevEntropy->litlengthCTable,0x524,
                            entropyWorkspace,entropyWkspSize);
  pFVar1 = local_70;
  pZVar6 = pZVar4;
  if (pZVar4 < (ZSTD_symbolEncodingTypeStats_t *)0xffffffffffffff89) {
    if (sVar2 == set_compressed) {
      __return_storage_ptr__->lastCountSize = (size_t)pZVar4;
    }
    pBVar5 = local_60 + (long)&pZVar4->LLtype;
    max_1 = 0x1f;
    local_78 = __return_storage_ptr__;
    sVar3 = HIST_countFast_wksp(countWorkspace,&max_1,local_68,(size_t)local_70,entropyWorkspace,
                                entropyWkspSize);
    prevCTable = local_40;
    nextCTable = local_48;
    local_48->offcode_repeatMode = local_40->offcode_repeatMode;
    sVar2 = ZSTD_selectEncodingType
                      (&local_48->offcode_repeatMode,countWorkspace,max_1,sVar3,(size_t)pFVar1,8,
                       local_40->offcodeCTable,OF_defaultNorm,5,(uint)(max_1 < 0x1d),strategy);
    pZVar6 = local_78;
    local_78->Offtype = sVar2;
    pZVar4 = (ZSTD_symbolEncodingTypeStats_t *)
             ZSTD_buildCTable(pBVar5,(long)dstEnd - (long)pBVar5,nextCTable->offcodeCTable,8,sVar2,
                              countWorkspace,max_1,(BYTE *)local_68,(size_t)pFVar1,OF_defaultNorm,5,
                              0x1c,prevCTable->offcodeCTable,0x304,entropyWorkspace,entropyWkspSize)
    ;
    pFVar1 = local_70;
    if ((ZSTD_symbolEncodingTypeStats_t *)0xffffffffffffff88 < pZVar4) {
      pZVar6->size = (size_t)pZVar4;
      return pZVar4;
    }
    local_68 = nextCTable->matchlengthCTable;
    if (sVar2 == set_compressed) {
      local_78->lastCountSize = (size_t)pZVar4;
    }
    pBVar5 = pBVar5 + (long)pZVar4;
    max_2 = 0x34;
    sVar3 = HIST_countFast_wksp(countWorkspace,&max_2,local_50,(size_t)local_70,entropyWorkspace,
                                entropyWkspSize);
    local_48->matchlength_repeatMode = local_40->matchlength_repeatMode;
    prevCTable_00 = local_40->matchlengthCTable;
    sVar2 = ZSTD_selectEncodingType
                      (&local_48->matchlength_repeatMode,countWorkspace,max_2,sVar3,(size_t)pFVar1,9
                       ,prevCTable_00,ML_defaultNorm,6,ZSTD_defaultAllowed,strategy);
    __return_storage_ptr__ = local_78;
    local_78->MLtype = sVar2;
    pZVar4 = (ZSTD_symbolEncodingTypeStats_t *)
             ZSTD_buildCTable(pBVar5,(long)dstEnd - (long)pBVar5,local_68,9,sVar2,countWorkspace,
                              max_2,local_50,(size_t)pFVar1,ML_defaultNorm,6,0x34,prevCTable_00,
                              0x5ac,entropyWorkspace,entropyWkspSize);
    if ((ZSTD_symbolEncodingTypeStats_t *)0xffffffffffffff88 < pZVar4) {
      __return_storage_ptr__->size = (size_t)pZVar4;
      return pZVar4;
    }
    if (sVar2 == set_compressed) {
      __return_storage_ptr__->lastCountSize = (size_t)pZVar4;
    }
    pZVar6 = (ZSTD_symbolEncodingTypeStats_t *)(pBVar5 + (long)pZVar4 + -(long)local_60);
  }
  __return_storage_ptr__->size = (size_t)pZVar6;
  return pZVar4;
}

Assistant:

static ZSTD_symbolEncodingTypeStats_t
ZSTD_buildSequencesStatistics(seqStore_t* seqStorePtr, size_t nbSeq,
                        const ZSTD_fseCTables_t* prevEntropy, ZSTD_fseCTables_t* nextEntropy,
                              BYTE* dst, const BYTE* const dstEnd,
                              ZSTD_strategy strategy, unsigned* countWorkspace,
                              void* entropyWorkspace, size_t entropyWkspSize) {
    BYTE* const ostart = dst;
    const BYTE* const oend = dstEnd;
    BYTE* op = ostart;
    FSE_CTable* CTable_LitLength = nextEntropy->litlengthCTable;
    FSE_CTable* CTable_OffsetBits = nextEntropy->offcodeCTable;
    FSE_CTable* CTable_MatchLength = nextEntropy->matchlengthCTable;
    const BYTE* const ofCodeTable = seqStorePtr->ofCode;
    const BYTE* const llCodeTable = seqStorePtr->llCode;
    const BYTE* const mlCodeTable = seqStorePtr->mlCode;
    ZSTD_symbolEncodingTypeStats_t stats;

    stats.lastCountSize = 0;
    /* convert length/distances into codes */
    ZSTD_seqToCodes(seqStorePtr);
    assert(op <= oend);
    assert(nbSeq != 0); /* ZSTD_selectEncodingType() divides by nbSeq */
    /* build CTable for Literal Lengths */
    {   unsigned max = MaxLL;
        size_t const mostFrequent = HIST_countFast_wksp(countWorkspace, &max, llCodeTable, nbSeq, entropyWorkspace, entropyWkspSize);   /* can't fail */
        DEBUGLOG(5, "Building LL table");
        nextEntropy->litlength_repeatMode = prevEntropy->litlength_repeatMode;
        stats.LLtype = ZSTD_selectEncodingType(&nextEntropy->litlength_repeatMode,
                                        countWorkspace, max, mostFrequent, nbSeq,
                                        LLFSELog, prevEntropy->litlengthCTable,
                                        LL_defaultNorm, LL_defaultNormLog,
                                        ZSTD_defaultAllowed, strategy);
        assert(set_basic < set_compressed && set_rle < set_compressed);
        assert(!(stats.LLtype < set_compressed && nextEntropy->litlength_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(
                op, (size_t)(oend - op),
                CTable_LitLength, LLFSELog, (symbolEncodingType_e)stats.LLtype,
                countWorkspace, max, llCodeTable, nbSeq,
                LL_defaultNorm, LL_defaultNormLog, MaxLL,
                prevEntropy->litlengthCTable,
                sizeof(prevEntropy->litlengthCTable),
                entropyWorkspace, entropyWkspSize);
            if (ZSTD_isError(countSize)) {
                DEBUGLOG(3, "ZSTD_buildCTable for LitLens failed");
                stats.size = countSize;
                return stats;
            }
            if (stats.LLtype == set_compressed)
                stats.lastCountSize = countSize;
            op += countSize;
            assert(op <= oend);
    }   }
    /* build CTable for Offsets */
    {   unsigned max = MaxOff;
        size_t const mostFrequent = HIST_countFast_wksp(
            countWorkspace, &max, ofCodeTable, nbSeq, entropyWorkspace, entropyWkspSize);  /* can't fail */
        /* We can only use the basic table if max <= DefaultMaxOff, otherwise the offsets are too large */
        ZSTD_defaultPolicy_e const defaultPolicy = (max <= DefaultMaxOff) ? ZSTD_defaultAllowed : ZSTD_defaultDisallowed;
        DEBUGLOG(5, "Building OF table");
        nextEntropy->offcode_repeatMode = prevEntropy->offcode_repeatMode;
        stats.Offtype = ZSTD_selectEncodingType(&nextEntropy->offcode_repeatMode,
                                        countWorkspace, max, mostFrequent, nbSeq,
                                        OffFSELog, prevEntropy->offcodeCTable,
                                        OF_defaultNorm, OF_defaultNormLog,
                                        defaultPolicy, strategy);
        assert(!(stats.Offtype < set_compressed && nextEntropy->offcode_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(
                op, (size_t)(oend - op),
                CTable_OffsetBits, OffFSELog, (symbolEncodingType_e)stats.Offtype,
                countWorkspace, max, ofCodeTable, nbSeq,
                OF_defaultNorm, OF_defaultNormLog, DefaultMaxOff,
                prevEntropy->offcodeCTable,
                sizeof(prevEntropy->offcodeCTable),
                entropyWorkspace, entropyWkspSize);
            if (ZSTD_isError(countSize)) {
                DEBUGLOG(3, "ZSTD_buildCTable for Offsets failed");
                stats.size = countSize;
                return stats;
            }
            if (stats.Offtype == set_compressed)
                stats.lastCountSize = countSize;
            op += countSize;
            assert(op <= oend);
    }   }
    /* build CTable for MatchLengths */
    {   unsigned max = MaxML;
        size_t const mostFrequent = HIST_countFast_wksp(
            countWorkspace, &max, mlCodeTable, nbSeq, entropyWorkspace, entropyWkspSize);   /* can't fail */
        DEBUGLOG(5, "Building ML table (remaining space : %i)", (int)(oend-op));
        nextEntropy->matchlength_repeatMode = prevEntropy->matchlength_repeatMode;
        stats.MLtype = ZSTD_selectEncodingType(&nextEntropy->matchlength_repeatMode,
                                        countWorkspace, max, mostFrequent, nbSeq,
                                        MLFSELog, prevEntropy->matchlengthCTable,
                                        ML_defaultNorm, ML_defaultNormLog,
                                        ZSTD_defaultAllowed, strategy);
        assert(!(stats.MLtype < set_compressed && nextEntropy->matchlength_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(
                op, (size_t)(oend - op),
                CTable_MatchLength, MLFSELog, (symbolEncodingType_e)stats.MLtype,
                countWorkspace, max, mlCodeTable, nbSeq,
                ML_defaultNorm, ML_defaultNormLog, MaxML,
                prevEntropy->matchlengthCTable,
                sizeof(prevEntropy->matchlengthCTable),
                entropyWorkspace, entropyWkspSize);
            if (ZSTD_isError(countSize)) {
                DEBUGLOG(3, "ZSTD_buildCTable for MatchLengths failed");
                stats.size = countSize;
                return stats;
            }
            if (stats.MLtype == set_compressed)
                stats.lastCountSize = countSize;
            op += countSize;
            assert(op <= oend);
    }   }
    stats.size = (size_t)(op-ostart);
    return stats;
}